

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O1

bool __thiscall
RX::match(RX *this,vector<int,_std::allocator<int>_> *start,vector<int,_std::allocator<int>_> *end,
         string *in)

{
  size_type sVar1;
  iterator iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  regmatch_t rm [2];
  int local_4c;
  regmatch_t local_48 [3];
  
  if (this->_compiled == false) {
    compile(this);
  }
  sVar1 = in->_M_string_length;
  iVar4 = 0;
  iVar3 = regexec((regex_t *)&this->_regex,(in->_M_dataplus)._M_p,2,local_48,0);
  iVar5 = (int)sVar1;
  if (0 < iVar5 && iVar3 == 0) {
    do {
      local_4c = local_48[0].rm_so + iVar4;
      iVar2._M_current =
           (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(start,iVar2,&local_4c);
      }
      else {
        *iVar2._M_current = local_4c;
        (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      local_4c = local_48[0].rm_eo + iVar4;
      iVar2._M_current =
           (end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(end,iVar2,&local_4c);
      }
      else {
        *iVar2._M_current = local_4c;
        (end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      iVar4 = (uint)(local_48[0].rm_so == local_48[0].rm_eo) + iVar4 + local_48[0].rm_eo;
      iVar3 = regexec((regex_t *)&this->_regex,(in->_M_dataplus)._M_p + iVar4,2,local_48,0);
    } while ((iVar3 == 0) && (iVar4 < iVar5));
  }
  return (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish !=
         (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
}

Assistant:

bool RX::match (
  std::vector <int>& start,
  std::vector <int>& end,
  const std::string& in)
{
  if (!_compiled)
    compile ();

  regmatch_t rm[2];
  int offset = 0;
  int length = in.length ();
  while (regexec (&_regex, in.c_str () + offset, 2, &rm[0], 0) == 0 &&
         offset < length)
  {
    start.push_back (rm[0].rm_so + offset);
    end.push_back   (rm[0].rm_eo + offset);
    offset += rm[0].rm_eo;

    // Protection against zero-width patterns causing infinite loops.
    if (rm[0].rm_so == rm[0].rm_eo)
      ++offset;
  }

  return start.size () ? true : false;
}